

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

void __thiscall avro::NodeMap::NodeMap(NodeMap *this,SingleLeaf *values)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  sp_counted_base *psVar4;
  shared_count sVar5;
  Node *__tmp_1;
  NodePrimitive *p;
  Node *__tmp;
  undefined8 uVar6;
  NodePtr key;
  shared_ptr<avro::Node> sStack_68;
  MultiAttribute<boost::shared_ptr<avro::Node>_> local_58;
  element_type *local_38;
  shared_count asStack_30 [2];
  
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::MultiAttribute(&local_58,values);
  (this->super_NodeImplMap).super_Node.type_ = AVRO_MAP;
  (this->super_NodeImplMap).super_Node.locked_ = false;
  (this->super_NodeImplMap).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_001ce5a8;
  std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
  vector(&(this->super_NodeImplMap).leafAttributes_.attrs_,&local_58.attrs_);
  std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
  ~vector(&local_58.attrs_);
  (this->super_NodeImplMap).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_001ced60;
  p = (NodePrimitive *)operator_new(0x18);
  (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_STRING;
  (p->super_NodeImplPrimitive).super_Node.locked_ = false;
  (p->super_NodeImplPrimitive).super_Node._vptr_Node = (_func_int **)&PTR__Node_001ce950;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>(&sStack_68,p);
  (*(this->super_NodeImplMap).super_Node._vptr_Node[0x12])(this,&sStack_68);
  psVar1 = (this->super_NodeImplMap).leafAttributes_.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->super_NodeImplMap).leafAttributes_.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == psVar1) {
    uVar6 = 0;
  }
  else {
    if (1 < (ulong)((long)psVar2 - (long)psVar1 >> 4)) {
      local_38 = psVar1->px;
      asStack_30[0].pi_ = (psVar1->pn).pi_;
      (psVar1->pn).pi_ = (sp_counted_base *)0x0;
      psVar1->px = (element_type *)0x0;
      peVar3 = psVar1[1].px;
      psVar4 = psVar1[1].pn.pi_;
      psVar1[1].pn.pi_ = (sp_counted_base *)0x0;
      psVar1[1].px = (element_type *)0x0;
      local_58.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar1->px;
      psVar1->px = peVar3;
      local_58.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar1->pn).pi_;
      (psVar1->pn).pi_ = psVar4;
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_58.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      sVar5.pi_ = asStack_30[0].pi_;
      peVar3 = local_38;
      local_38 = (element_type *)0x0;
      asStack_30[0].pi_ = (sp_counted_base *)0x0;
      local_58.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar1[1].px;
      local_58.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)psVar1[1].pn.pi_;
      psVar1[1].px = peVar3;
      psVar1[1].pn.pi_ = sVar5.pi_;
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_58.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      boost::detail::shared_count::~shared_count(asStack_30);
      boost::detail::shared_count::~shared_count(&sStack_68.pn);
      return;
    }
    uVar6 = 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
}

Assistant:

explicit NodeMap(const SingleLeaf &values) :
        NodeImplMap(AVRO_MAP, NoName(), values, NoLeafNames(), NoSize())
    { 
        // need to add the key for the map too
        NodePtr key(new NodePrimitive(AVRO_STRING));
        doAddLeaf(key);

        // key goes before value
        std::swap(leafAttributes_.get(0), leafAttributes_.get(1));
    }